

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O2

PtexFaceData * __thiscall Ptex::v2_2::PtexReader::getData(PtexReader *this,int faceid)

{
  undefined2 uVar6;
  int iVar1;
  uint8_t *puVar2;
  PtexFaceData *pPVar3;
  Level *level;
  FaceData *pFVar4;
  pointer pFVar5;
  
  if (((-1 < faceid) && (this->_ok != false)) && ((uint)faceid < (this->_header).nfaces)) {
    pFVar5 = (this->_faceinfo).
             super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>._M_impl
             .super__Vector_impl_data._M_start;
    if (((pFVar5[(uint)faceid].flags & 1) == 0) &&
       (pFVar5 = pFVar5 + (uint)faceid, (pFVar5->res).vlog2 != '\0' || (pFVar5->res).ulog2 != '\0'))
    {
      level = getLevel(this,0);
      uVar6._0_1_ = (pFVar5->res).ulog2;
      uVar6._1_1_ = (pFVar5->res).vlog2;
      pFVar4 = getFace(this,0,level,faceid,(Res)uVar6);
      return &pFVar4->super_PtexFaceData;
    }
    pPVar3 = (PtexFaceData *)operator_new(0x18);
    iVar1 = this->_pixelsize;
    puVar2 = this->_constdata;
    pPVar3->_vptr_PtexFaceData = (_func_int **)&PTR__PtexFaceData_00125d30;
    pPVar3[1]._vptr_PtexFaceData = (_func_int **)(puVar2 + faceid * iVar1);
    *(int *)&pPVar3[2]._vptr_PtexFaceData = iVar1;
    return pPVar3;
  }
  pFVar4 = errorData(this,true);
  return &pFVar4->super_PtexFaceData;
}

Assistant:

PtexFaceData* PtexReader::getData(int faceid)
{
    if (!_ok || faceid < 0 || size_t(faceid) >= _header.nfaces) {
        return errorData(/*deleteOnRelease*/ true);
    }

    FaceInfo& fi = _faceinfo[faceid];
    if (fi.isConstant() || fi.res == 0) {
        return new ConstDataPtr(getConstData() + faceid * _pixelsize, _pixelsize);
    }

    // get level zero (full) res face
    Level* level = getLevel(0);
    FaceData* face = getFace(0, level, faceid, fi.res);
    return face;
}